

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O3

void * __thiscall
MultiANN::NearestNeighbor(MultiANN *this,ANNpoint *x,int *best_idx,double *best_dist)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  ANNpoint pAVar7;
  ANNpoint pAVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_80;
  double local_78;
  int *local_70;
  double *local_68;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  local_78 = INFINITY;
  iVar9 = 0;
  uVar12 = 0x1f;
  local_70 = best_idx;
  local_68 = best_dist;
  do {
    if (this->AnnArray[uVar12 - 1] != (ANN *)0x0) {
      local_80 = 0.0;
      iVar9 = ANN::NearestNeighbor
                        (this->AnnArray[uVar12 - 1],this->topology,this->scaling,x,&local_80);
      if (local_80 < local_78) {
        *local_70 = iVar9;
        local_78 = local_80;
      }
      iVar9 = ANN::LastNode(this->AnnArray[uVar12 - 1]);
      iVar9 = (uint)(iVar9 != this->size) + iVar9;
    }
    uVar12 = uVar12 - 1;
  } while (4 < uVar12);
  if (iVar9 != this->size) {
    lVar13 = (long)iVar9;
    do {
      pAVar7 = this->points_coor[lVar13];
      local_80 = 0.0;
      iVar9 = this->dimension;
      dVar14 = 0.0;
      if (0 < iVar9) {
        iVar11 = 0;
        dVar14 = 0.0;
        do {
          iVar6 = this->topology[iVar11];
          if (iVar6 == 3) {
            dVar14 = pAVar7[iVar11];
            pAVar8 = *x;
            dVar15 = pAVar8[iVar11];
            dVar16 = pAVar7[(long)iVar11 + 1];
            dVar1 = pAVar7[(long)iVar11 + 2];
            dVar2 = pAVar8[(long)iVar11 + 1];
            dVar3 = pAVar8[(long)iVar11 + 2];
            dVar4 = pAVar7[(long)iVar11 + 3];
            dVar5 = pAVar8[(long)iVar11 + 3];
            local_58 = dVar4 * dVar5 + dVar1 * dVar3 + dVar14 * dVar15 + dVar16 * dVar2;
            if (1.0 < local_58) {
              local_58 = local_58 /
                         ((dVar5 * dVar5 + dVar3 * dVar3 + dVar15 * dVar15 + dVar2 * dVar2) *
                         (dVar4 * dVar4 + dVar1 * dVar1 + dVar14 * dVar14 + dVar16 * dVar16));
            }
            uStack_50 = 0;
            iVar10 = iVar11 + 3;
            local_60 = acos(local_58);
            local_48 = -local_58;
            uStack_40 = uStack_50 ^ 0x8000000000000000;
            dVar14 = acos(local_48);
            dVar14 = acos((double)(~-(ulong)(dVar14 < local_60) & (ulong)local_58 |
                                  (ulong)local_48 & -(ulong)(dVar14 < local_60)));
            dVar14 = dVar14 * this->scaling[iVar11];
            dVar14 = dVar14 * dVar14 + local_80;
            iVar9 = this->dimension;
            local_80 = dVar14;
          }
          else {
            iVar10 = iVar11;
            if (iVar6 == 2) {
              dVar16 = ABS(pAVar7[iVar11] - (*x)[iVar11]);
              dVar15 = 6.283185307179586 - dVar16;
              if (dVar16 <= 6.283185307179586 - dVar16) {
                dVar15 = dVar16;
              }
              dVar15 = dVar15 * this->scaling[iVar11];
              dVar15 = dVar15 * dVar15;
            }
            else {
              if (iVar6 != 1) goto LAB_00104bed;
              dVar15 = (pAVar7[iVar11] - (*x)[iVar11]) * this->scaling[iVar11];
              dVar15 = dVar15 * dVar15;
            }
            dVar14 = dVar14 + dVar15;
            local_80 = dVar14;
          }
LAB_00104bed:
          iVar11 = iVar10 + 1;
        } while (iVar11 < iVar9);
      }
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      if (dVar14 < local_78) {
        *local_70 = (int)lVar13;
        local_78 = dVar14;
      }
      lVar13 = lVar13 + 1;
    } while (this->size != (int)lVar13);
  }
  *local_68 = local_78;
  return this->points_ptr[*local_70];
}

Assistant:

void *MultiANN::NearestNeighbor(  // 1-nearest neighbor query
    const ANNpoint &x,            // query point
    int &best_idx,      // index of the nearest neighbor to x (returned)
    double &best_dist)  // distance from the nearest neighbor to x (returned)
{
    int n, n_last;
    int k;
    double d, d_min;

    n = n_last = 0;  // Keeps the warnings away
    d_min = INFINITY;
    d = 0.0;

    for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX;
         k--) {             // Find the nearest neighbor
        if (AnnArray[k]) {  // First check the ANN trees
            d = 0.0;
            n = AnnArray[k]->NearestNeighbor(topology, scaling, x, d);
            if (d < d_min) {
                d_min = d;
                best_idx = n;
            }
            n_last = AnnArray[k]->LastNode();
            if (n_last != size) n_last++;
        }
    }

    for (n = n_last; n != size;
         n++) {  // Check the new nodes, which are not yet in the ANN tree
        ANNpoint x1 = points_coor[n];
        d = 0.0;
        for (int i = 0; i < dimension; i++) {
            if (topology[i] == 1) {
                d += ANN_POW(scaling[i] * (x1[i] - x[i]));
            } else if (topology[i] == 2) {
                double t = fabs(x1[i] - x[i]);
                double t1 = ANN_MIN(t, 2.0 * PI - t);
                d += ANN_POW(scaling[i] * t1);
            } else if (topology[i] == 3) {
                double fd = x1[i] * x[i] + x1[i + 1] * x[i + 1] +
                            x1[i + 2] * x[i + 2] + x1[i + 3] * x[i + 3];
                if (fd > 1) {
                    double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                                   x1[i + 2] * x1[i + 2] +
                                   x1[i + 3] * x1[i + 3];
                    double norm2 = x[i] * x[i] + x[i + 1] * x[i + 1] +
                                   x[i + 2] * x[i + 2] + x[i + 3] * x[i + 3];
                    fd = fd / (norm1 * norm2);
                }
                double dtheta = ANN_MIN(acos(fd), acos(-fd));
                d += ANN_POW(scaling[i] * dtheta);
                i = i + 3;
            }
        }
        d = sqrt(d);
        if (d < d_min) {
            d_min = d;
            best_idx = n;
        }
    }

    best_dist = d_min;
    return points_ptr[best_idx];
}